

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::ShaderControlStatementTests::init
          (ShaderControlStatementTests *this,EVP_PKEY_CTX *ctx)

{
  LoopType LVar1;
  _func_int **pp_Var2;
  PerfCaseType PVar3;
  TestNode *pTVar4;
  ShaderPerformanceCaseGroup *pSVar5;
  long *plVar6;
  ShaderPerformanceCase *pSVar7;
  long *plVar8;
  PerfCaseType PVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  int iVar14;
  bool bVar15;
  string caseName;
  long *local_f8;
  long local_e8;
  long lStack_e0;
  TestNode *local_d8;
  ShaderPerformanceCaseGroup *local_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  TestNode *local_a8;
  char *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"if_else",
             "if-else Conditional Performance Tests");
  local_a8 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  local_d8 = (TestNode *)this;
  PVar9 = CASETYPE_VERTEX;
  do {
    pSVar5 = (ShaderPerformanceCaseGroup *)operator_new(0x80);
    pcVar13 = "Vertex and fragment";
    if (PVar9 == CASETYPE_VERTEX) {
      pcVar13 = "Unexpected vertex";
    }
    deqp::gls::ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup
              (pSVar5,((TestNode *)this)->m_testCtx,pcVar13 + 0xb,
               glcts::fixed_sample_locations_values + 1);
    local_d0 = pSVar5;
    tcu::TestNode::addChild(local_a8,(TestNode *)pSVar5);
    local_a0 = "varying";
    if (PVar9 == CASETYPE_VERTEX) {
      local_a0 = "attribute";
    }
    iVar12 = 0;
    do {
      iVar14 = 0;
      do {
        iVar10 = 0;
        do {
          if (iVar12 == 2 || iVar10 != 2) {
            local_58[0] = local_48;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_58,0x1b32ab9,0x1b32ab9);
            plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
            local_98 = &local_88;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_88 = *plVar8;
              lStack_80 = plVar6[3];
            }
            else {
              local_88 = *plVar8;
              local_98 = (long *)*plVar6;
            }
            local_90 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
            local_78 = &local_68;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_68 = *plVar8;
              lStack_60 = plVar6[3];
            }
            else {
              local_68 = *plVar8;
              local_78 = (long *)*plVar6;
            }
            local_70 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
            local_c8 = &local_b8;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_b8 = *plVar8;
              lStack_b0 = plVar6[3];
            }
            else {
              local_b8 = *plVar8;
              local_c8 = (long *)*plVar6;
            }
            local_c0 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
            local_f8 = &local_e8;
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_e8 = *plVar8;
              lStack_e0 = plVar6[3];
            }
            else {
              local_e8 = *plVar8;
              local_f8 = (long *)*plVar6;
            }
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if (local_c8 != &local_b8) {
              operator_delete(local_c8,local_b8 + 1);
            }
            if (local_78 != &local_68) {
              operator_delete(local_78,local_68 + 1);
            }
            if (local_98 != &local_88) {
              operator_delete(local_98,local_88 + 1);
            }
            if (local_58[0] != local_48) {
              operator_delete(local_58[0],local_48[0] + 1);
            }
            pSVar7 = (ShaderPerformanceCase *)operator_new(0x1f0);
            deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                      (pSVar7,(TestContext *)*local_d8[1]._vptr_TestNode,
                       (RenderContext *)local_d8[1]._vptr_TestNode[1],(char *)local_f8,
                       glcts::fixed_sample_locations_values + 1,PVar9);
            (pSVar7->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__ConditionalCase_0216fd00;
            *(int *)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode = iVar12;
            *(int *)((long)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar10;
            *(int *)&pSVar7[1].super_TestCase.super_TestNode.m_testCtx = iVar14;
            pSVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
            pSVar7[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
            *(undefined8 *)
             ((long)&pSVar7[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) = 0;
            *(undefined8 *)((long)&pSVar7[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = 0;
            deqp::gls::ShaderPerformanceCaseGroup::addChild(local_d0,pSVar7);
            if (local_f8 != &local_e8) {
              operator_delete(local_f8,local_e8 + 1);
            }
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 != 3);
        iVar14 = iVar14 + 1;
      } while (iVar14 != 3);
      iVar12 = iVar12 + 1;
    } while (iVar12 != 3);
    pSVar7 = (ShaderPerformanceCase *)operator_new(0x1c8);
    this = (ShaderControlStatementTests *)local_d8;
    if (PVar9 == CASETYPE_VERTEX) {
      deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                (pSVar7,(TestContext *)*local_d8[1]._vptr_TestNode,
                 (RenderContext *)local_d8[1]._vptr_TestNode[1],"reference",
                 glcts::fixed_sample_locations_values + 1,CASETYPE_VERTEX);
    }
    else {
      deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                (pSVar7,(TestContext *)*local_d8[1]._vptr_TestNode,
                 (RenderContext *)local_d8[1]._vptr_TestNode[1],"reference_unmixed",
                 glcts::fixed_sample_locations_values + 1,CASETYPE_FRAGMENT);
      (pSVar7->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderPerformanceCase_0216ff30;
      *(undefined1 *)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
      deqp::gls::ShaderPerformanceCaseGroup::addChild(local_d0,pSVar7);
      pSVar7 = (ShaderPerformanceCase *)operator_new(0x1c8);
      deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                (pSVar7,(TestContext *)*((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                 (RenderContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode[1],
                 "reference_mixed",glcts::fixed_sample_locations_values + 1,CASETYPE_FRAGMENT);
    }
    pSVar5 = local_d0;
    (pSVar7->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderPerformanceCase_0216ff30;
    *(bool *)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode = PVar9 == CASETYPE_VERTEX;
    deqp::gls::ShaderPerformanceCaseGroup::addChild(local_d0,pSVar7);
    pSVar7 = (ShaderPerformanceCase *)operator_new(0x1c0);
    deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
              (pSVar7,(TestContext *)*((TestNode *)((long)this + 0x70))->_vptr_TestNode,
               (RenderContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode[1],
               "reference_empty",glcts::fixed_sample_locations_values + 1,PVar9);
    (pSVar7->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderPerformanceCase_0216ffd0;
    deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar5,pSVar7);
    bVar15 = PVar9 == CASETYPE_VERTEX;
    PVar9 = PVar9 + CASETYPE_FRAGMENT;
  } while (bVar15);
  lVar11 = 0;
  do {
    pTVar4 = (TestNode *)operator_new(0x70);
    local_38 = lVar11;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,init::loopGroups[lVar11].name,
               init::loopGroups[lVar11].description);
    local_d0 = (ShaderPerformanceCaseGroup *)(init::loopGroups + lVar11);
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    local_a8 = pTVar4;
    PVar9 = CASETYPE_VERTEX;
    do {
      pSVar5 = (ShaderPerformanceCaseGroup *)operator_new(0x80);
      pcVar13 = "Vertex and fragment";
      if (PVar9 == CASETYPE_VERTEX) {
        pcVar13 = "Unexpected vertex";
      }
      deqp::gls::ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup
                (pSVar5,((TestNode *)this)->m_testCtx,pcVar13 + 0xb,
                 glcts::fixed_sample_locations_values + 1);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar5);
      local_a0 = "varying";
      if (PVar9 == CASETYPE_VERTEX) {
        local_a0 = "attribute";
      }
      iVar12 = 0;
      do {
        local_f8 = &local_e8;
        pcVar13 = "static";
        if (iVar12 != 0) {
          if (iVar12 == 1) {
            pcVar13 = "uniform";
          }
          else {
            pcVar13 = local_a0;
            if (iVar12 != 2) {
              pcVar13 = (char *)0x0;
            }
          }
        }
        pSVar7 = (ShaderPerformanceCase *)operator_new(0x1f0);
        if (iVar12 == 2) {
          pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,pcVar13,(allocator<char> *)&local_78);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_e8 = *plVar8;
            lStack_e0 = plVar6[3];
          }
          else {
            local_e8 = *plVar8;
            local_f8 = (long *)*plVar6;
          }
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          LVar1 = *(LoopType *)&(local_d0->super_TestCaseGroup).super_TestNode._vptr_TestNode;
          deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                    (pSVar7,(TestContext *)*pp_Var2,(RenderContext *)pp_Var2[1],(char *)local_f8,
                     glcts::fixed_sample_locations_values + 1,PVar9);
          (pSVar7->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__LoopCase_0216fd50;
          *(undefined4 *)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode = 2;
          *(LoopType *)((long)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = LVar1;
          *(undefined1 *)&pSVar7[1].super_TestCase.super_TestNode.m_testCtx = 1;
          pSVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
          pSVar7[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
          *(undefined8 *)
           ((long)&pSVar7[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pSVar7[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = 0;
          deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar5,pSVar7);
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,local_e8 + 1);
          }
          pTVar4 = local_d8;
          if (local_c8 != &local_b8) {
            operator_delete(local_c8,local_b8 + 1);
          }
          pSVar7 = (ShaderPerformanceCase *)operator_new(0x1f0);
          pp_Var2 = pTVar4[1]._vptr_TestNode;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,pcVar13,(allocator<char> *)&local_78);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_f8 = &local_e8;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_e8 = *plVar8;
            lStack_e0 = plVar6[3];
          }
          else {
            local_e8 = *plVar8;
            local_f8 = (long *)*plVar6;
          }
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                    (pSVar7,(TestContext *)*pp_Var2,(RenderContext *)pp_Var2[1],(char *)local_f8,
                     glcts::fixed_sample_locations_values + 1,PVar9);
          (pSVar7->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__LoopCase_0216fd50;
          *(undefined4 *)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode = 2;
          *(LoopType *)((long)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = LVar1;
          *(undefined1 *)&pSVar7[1].super_TestCase.super_TestNode.m_testCtx = 0;
          pSVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
          pSVar7[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
          *(undefined8 *)
           ((long)&pSVar7[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pSVar7[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = 0;
          deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar5,pSVar7);
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,local_e8 + 1);
          }
          this = (ShaderControlStatementTests *)local_d8;
          if (local_c8 != &local_b8) {
            operator_delete(local_c8,local_b8 + 1);
          }
        }
        else {
          LVar1 = *(LoopType *)&(local_d0->super_TestCaseGroup).super_TestNode._vptr_TestNode;
          deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                    (pSVar7,(TestContext *)*((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                     (RenderContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode[1],pcVar13,
                     glcts::fixed_sample_locations_values + 1,PVar9);
          (pSVar7->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__LoopCase_0216fd50;
          *(int *)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode = iVar12;
          *(LoopType *)((long)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = LVar1;
          *(undefined1 *)&pSVar7[1].super_TestCase.super_TestNode.m_testCtx = 1;
          pSVar7[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
          pSVar7[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
          *(undefined8 *)
           ((long)&pSVar7[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pSVar7[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = 0;
          deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar5,pSVar7);
          this = (ShaderControlStatementTests *)local_d8;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != 3);
      pSVar7 = (ShaderPerformanceCase *)operator_new(0x1c8);
      if (PVar9 == CASETYPE_VERTEX) {
        deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                  (pSVar7,(TestContext *)*((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   (RenderContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode[1],"reference"
                   ,glcts::fixed_sample_locations_values + 1,CASETYPE_VERTEX);
        pTVar4 = local_a8;
      }
      else {
        deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                  (pSVar7,(TestContext *)*((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   (RenderContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode[1],
                   "reference_stable",glcts::fixed_sample_locations_values + 1,CASETYPE_FRAGMENT);
        pTVar4 = local_a8;
        (pSVar7->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ShaderPerformanceCase_0216fec0;
        *(undefined1 *)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
        deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar5,pSVar7);
        pSVar7 = (ShaderPerformanceCase *)operator_new(0x1c8);
        deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                  (pSVar7,(TestContext *)*((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                   (RenderContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode[1],
                   "reference_unstable",glcts::fixed_sample_locations_values + 1,CASETYPE_FRAGMENT);
      }
      (pSVar7->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderPerformanceCase_0216fec0;
      *(bool *)&pSVar7[1].super_TestCase.super_TestNode._vptr_TestNode = PVar9 == CASETYPE_VERTEX;
      deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar5,pSVar7);
      PVar3 = PVar9 + CASETYPE_FRAGMENT;
      bVar15 = PVar9 == CASETYPE_VERTEX;
      this = (ShaderControlStatementTests *)local_d8;
      PVar9 = PVar3;
    } while (bVar15);
    lVar11 = local_38 + 1;
  } while (lVar11 != 3);
  return PVar3;
}

Assistant:

void ShaderControlStatementTests::init (void)
{
	// Conditional cases (if-else).

	tcu::TestCaseGroup* ifElseGroup = new tcu::TestCaseGroup(m_testCtx, "if_else", "if-else Conditional Performance Tests");
	addChild(ifElseGroup);

	for (int isFrag = 0; isFrag <= 1; isFrag++)
	{
		bool isVertex = isFrag == 0;
		ShaderPerformanceCaseGroup* vertexOrFragmentGroup = new ShaderPerformanceCaseGroup(m_testCtx, isVertex ? "vertex" : "fragment", "");
		ifElseGroup->addChild(vertexOrFragmentGroup);

		DE_STATIC_ASSERT(DECISION_STATIC == 0);
		for (int decisionType = (int)DECISION_STATIC; decisionType < (int)DECISION_LAST; decisionType++)
		{
			const char* decisionName = decisionType == (int)DECISION_STATIC		? "static" :
										decisionType == (int)DECISION_UNIFORM	? "uniform" :
										decisionType == (int)DECISION_ATTRIBUTE	? (isVertex ? "attribute" : "varying") :
																					DE_NULL;
			DE_ASSERT(decisionName != DE_NULL);

			for (int workloadDivision = 0; workloadDivision < ConditionalCase::WORKLOAD_DIVISION_LAST; workloadDivision++)
			{
				const char* workloadDivisionSuffix = workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_EVEN			? "" :
													 workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_TRUE_HEAVY		? "_with_heavier_true" :
													 workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_FALSE_HEAVY	? "_with_heavier_false" :
																																  DE_NULL;
				DE_ASSERT(workloadDivisionSuffix != DE_NULL);

				DE_STATIC_ASSERT(ConditionalCase::BRANCH_TRUE == 0);
				for (int branchResult = (int)ConditionalCase::BRANCH_TRUE; branchResult < (int)ConditionalCase::BRANCH_LAST; branchResult++)
				{
					if (decisionType != (int)DECISION_ATTRIBUTE && branchResult == (int)ConditionalCase::BRANCH_MIXED)
						continue;

					const char* branchResultName = branchResult == (int)ConditionalCase::BRANCH_TRUE	? "true" :
												   branchResult == (int)ConditionalCase::BRANCH_FALSE	? "false" :
												   branchResult == (int)ConditionalCase::BRANCH_MIXED	? "mixed" :
																										  DE_NULL;
					DE_ASSERT(branchResultName != DE_NULL);

					string caseName = string("") + decisionName + "_" + branchResultName + workloadDivisionSuffix;

					vertexOrFragmentGroup->addChild(new ConditionalCase(m_context, caseName.c_str(), "",
																		(DecisionType)decisionType, (ConditionalCase::BranchResult)branchResult,
																		(ConditionalCase::WorkloadDivision)workloadDivision, isVertex));
				}
			}
		}

		if (isVertex)
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference", "", true, isVertex));
		else
		{
			// Only fragment case with BRANCH_MIXED has an additional fract() call.
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference_unmixed", "", true, isVertex));
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference_mixed", "", false, isVertex));
		}

		vertexOrFragmentGroup->addChild(new EmptyWorkloadReferenceCase(m_context, "reference_empty", "", isVertex));
	}

	// Loop cases.

	static const struct
	{
		LoopCase::LoopType	type;
		const char*			name;
		const char*			description;
	} loopGroups[] =
	{
		{LoopCase::LOOP_FOR,		"for",		"for Loop Performance Tests"},
		{LoopCase::LOOP_WHILE,		"while",	"while Loop Performance Tests"},
		{LoopCase::LOOP_DO_WHILE,	"do_while",	"do-while Loop Performance Tests"}
	};

	for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(loopGroups); groupNdx++)
	{
		tcu::TestCaseGroup* currentLoopGroup = new tcu::TestCaseGroup(m_testCtx, loopGroups[groupNdx].name, loopGroups[groupNdx].description);
		addChild(currentLoopGroup);

		for (int isFrag = 0; isFrag <= 1; isFrag++)
		{
			bool isVertex = isFrag == 0;
			ShaderPerformanceCaseGroup* vertexOrFragmentGroup = new ShaderPerformanceCaseGroup(m_testCtx, isVertex ? "vertex" : "fragment", "");
			currentLoopGroup->addChild(vertexOrFragmentGroup);

			DE_STATIC_ASSERT(DECISION_STATIC == 0);
			for (int decisionType = (int)DECISION_STATIC; decisionType < (int)DECISION_LAST; decisionType++)
			{
				const char* decisionName = decisionType == (int)DECISION_STATIC		? "static" :
										   decisionType == (int)DECISION_UNIFORM	? "uniform" :
										   decisionType == (int)DECISION_ATTRIBUTE	? (isVertex ? "attribute" : "varying") :
																					  DE_NULL;
				DE_ASSERT(decisionName != DE_NULL);

				if (decisionType == (int)DECISION_ATTRIBUTE)
				{
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, (string(decisionName) + "_stable").c_str(), "", loopGroups[groupNdx].type, (DecisionType)decisionType, true, isVertex));
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, (string(decisionName) + "_unstable").c_str(), "", loopGroups[groupNdx].type, (DecisionType)decisionType, false, isVertex));
				}
				else
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, decisionName, "", loopGroups[groupNdx].type, (DecisionType)decisionType, true, isVertex));

			}

			if (isVertex)
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference", "", true, isVertex));
			else
			{
				// Only fragment case with unstable attribute has an additional fract() call.
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference_stable", "", true, isVertex));
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference_unstable", "", false, isVertex));
			}
		}
	}
}